

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goodbye_button.cpp
# Opt level: O3

int main(void)

{
  ushort uVar1;
  Am_Wrapper *pAVar2;
  undefined8 uVar3;
  Am_Object *pAVar4;
  Am_Object aAStack_38 [8];
  Am_Object local_30 [8];
  Am_Object local_28 [8];
  Am_Object local_20 [8];
  Am_Object local_18 [8];
  Am_Object local_10 [8];
  
  Am_Initialize();
  Am_Object::Create((char *)local_10);
  uVar1 = Am_Object::Set((ushort)local_10,100,0x32);
  uVar1 = Am_Object::Set(uVar1,0x65,0x32);
  uVar1 = Am_Object::Set(uVar1,0x66,200);
  uVar1 = Am_Object::Set(uVar1,0x67,0x32);
  pAVar2 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar3 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar2);
  Am_Object::Create((char *)local_28);
  Am_Object::Create((char *)aAStack_38);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)aAStack_38,(char *)0x150,0x102012);
  Am_Object::Am_Object(local_30,pAVar4);
  pAVar4 = (Am_Object *)Am_Object::Set_Part(local_28,0xc5,local_30,0);
  Am_Object::Am_Object(local_20,pAVar4);
  pAVar4 = (Am_Object *)Am_Object::Add_Part(uVar3,local_20,1,0);
  Am_Object::Am_Object(local_18,pAVar4);
  Am_Object::Add_Part(&Am_Screen,local_18,1,0);
  Am_Object::~Am_Object(local_18);
  Am_Object::~Am_Object(local_20);
  Am_Object::~Am_Object(local_30);
  Am_Object::~Am_Object(aAStack_38);
  Am_Object::~Am_Object(local_28);
  Am_Object::~Am_Object(local_10);
  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}

Assistant:

int main( void )
{
  Am_Initialize();

  Am_Screen
    .Add_Part( Am_Window.Create("window")
      .Set( Am_LEFT, 50 )
      .Set( Am_TOP, 50 )
      .Set( Am_WIDTH, 200 )
      .Set( Am_HEIGHT, 50 )
      .Set( Am_FILL_STYLE, Am_Amulet_Purple )
      .Add_Part( Am_Button.Create("button")
        .Set_Part( Am_COMMAND, Am_Quit_No_Ask_Command.Create()
          .Set( Am_LABEL, "Goodbye, world!" )
        )
      )
    );

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}